

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O3

int sc_core::sc_report_handler::stop_after(char *msg_type_,sc_severity severity_,int limit)

{
  uint uVar1;
  sc_msg_def *psVar2;
  uint uVar3;
  uint uVar4;
  
  psVar2 = mdlookup(msg_type_);
  if (psVar2 == (sc_msg_def *)0x0) {
    psVar2 = add_msg_type(msg_type_);
  }
  uVar4 = 1 << ((byte)(severity_ + SC_WARNING) & 0x1f);
  uVar1 = psVar2->limit_mask;
  if ((uVar1 >> (severity_ + SC_WARNING & 0x1f) & 1) == 0) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = psVar2->sev_limit[severity_];
  }
  if (limit < 0) {
    psVar2->limit_mask = uVar1 & ~uVar4;
  }
  else {
    psVar2->limit_mask = uVar1 | uVar4;
    psVar2->sev_limit[severity_] = limit;
  }
  return uVar3;
}

Assistant:

int sc_report_handler::stop_after(const char * msg_type_,
				  sc_severity severity_,
				  int limit)
{
    sc_msg_def * md = mdlookup(msg_type_);

    if ( !md )
	md = add_msg_type(msg_type_);

    int mask = 1 << (severity_ + 1);
    int old = md->limit_mask & mask ?  md->sev_limit[severity_]: UINT_MAX;

    if ( limit < 0 )
	md->limit_mask &= ~mask;
    else
    {
	md->limit_mask |= mask;
	md->sev_limit[severity_] = limit;
    }
    return old;
}